

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O3

bool __thiscall
gl3cts::TransformFeedback::CaptureVertexInterleaved::checkFramebuffer
          (CaptureVertexInterleaved *this,GLenum primitive_type)

{
  RenderContext *pRVar1;
  int iVar2;
  deUint32 err;
  undefined4 extraout_var;
  undefined8 *puVar3;
  long lVar4;
  value_type_conflict2 *__val;
  undefined4 in_register_00000034;
  bool bVar5;
  float fVar6;
  
  pRVar1 = this->m_context->m_renderCtx;
  iVar2 = (*pRVar1->_vptr_RenderContext[3])(pRVar1,CONCAT44(in_register_00000034,primitive_type));
  puVar3 = (undefined8 *)operator_new(0x10);
  *puVar3 = 0;
  puVar3[1] = 0;
  (**(code **)(CONCAT44(extraout_var,iVar2) + 0x1220))(0,0,2,2,0x1903,0x1406,puVar3);
  err = (**(code **)(CONCAT44(extraout_var,iVar2) + 0x800))();
  glu::checkError(err,"glReadPixels call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0xa54);
  lVar4 = 0;
  do {
    fVar6 = ABS(*(float *)((long)puVar3 + lVar4) + -0.5);
    if (0.0625 < fVar6) break;
    bVar5 = lVar4 != 0xc;
    lVar4 = lVar4 + 4;
  } while (bVar5);
  operator_delete(puVar3,0x10);
  return fVar6 <= 0.0625;
}

Assistant:

bool gl3cts::TransformFeedback::CaptureVertexInterleaved::checkFramebuffer(glw::GLenum primitive_type UNUSED)
{
	/* Functions handler */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Fetch framebuffer. */
	std::vector<glw::GLfloat> pixels(s_framebuffer_size * s_framebuffer_size);

	if ((s_framebuffer_size > 0) && (s_framebuffer_size > 0))
	{
		gl.readPixels(0, 0, s_framebuffer_size, s_framebuffer_size, GL_RED, GL_FLOAT, pixels.data());
		GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels call failed.");
	}

	/* Check results.
	 Note: assuming that s_buffer_size == 2 -> then all points shall be drawn. */
	for (std::vector<glw::GLfloat>::iterator i = pixels.begin(); i != pixels.end(); ++i)
	{
		if (fabs(*i - 0.5f) > 0.0625f /* precision */)
		{
			return false;
		}
	}

	return true;
}